

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O2

void osgen_sb_mode_end(void)

{
  size_t *psVar1;
  int iVar2;
  int left;
  osgen_txtwin_t *win;
  char **ppcVar3;
  char **ppcVar4;
  int top;
  size_t sVar5;
  
  win = S_sbmode_win;
  iVar2 = (S_sbmode_win->base).scrolly;
  if (iVar2 - S_sbmode_orig_scrolly == 0 || iVar2 < S_sbmode_orig_scrolly) {
    if (iVar2 < S_sbmode_orig_scrolly) {
      osgen_scroll_win_fwd(S_sbmode_win,(long)(S_sbmode_orig_scrolly - iVar2));
    }
  }
  else {
    osgen_scroll_win_back(S_sbmode_win,iVar2 - S_sbmode_orig_scrolly);
  }
  iVar2 = (win->base).scrolly;
  S_gets_y = S_gets_y + (S_sbmode_orig_scrolly - iVar2);
  left = (win->base).winx;
  top = (win->base).winy + -1;
  (win->base).winy = top;
  psVar1 = &(win->base).ht;
  *psVar1 = *psVar1 + 1;
  (win->base).scrolly = iVar2 + -1;
  ossclr(top,left,top,left + (int)(win->base).wid + -1,(win->base).oss_fillcolor);
  osgen_scrdisp(&win->base,0,0,(int)(win->base).wid);
  (win->base).x = S_sbmode_orig_x;
  win->txtfree = S_sbmode_orig_txtfree;
  ppcVar3 = S_sbmode_orig_last_line;
  sVar5 = win->line_count;
  while( true ) {
    if (sVar5 < 2) {
      S_sbmode_win = (osgen_txtwin_t *)0x0;
      return;
    }
    iVar2 = (win->base).y;
    ppcVar4 = osgen_get_line_ptr(win,iVar2);
    if (ppcVar4 == ppcVar3) break;
    sVar5 = sVar5 - 1;
    win->line_count = sVar5;
    (win->base).y = iVar2 + -1;
  }
  S_sbmode_win = (osgen_txtwin_t *)0x0;
  return;
}

Assistant:

static void osgen_sb_mode_end()
{
    osgen_txtwin_t *win = S_sbmode_win;
    
    /* restore our original scroll position */
    if (win->base.scrolly > S_sbmode_orig_scrolly)
        osgen_scroll_win_back(win, win->base.scrolly - S_sbmode_orig_scrolly);
    else if (win->base.scrolly < S_sbmode_orig_scrolly)
        osgen_scroll_win_fwd(win, S_sbmode_orig_scrolly - win->base.scrolly);

    /* 
     *   adjust the input editing cursor position if the scrolling position
     *   doesn't match the original position 
     */
    S_gets_y += S_sbmode_orig_scrolly - win->base.scrolly;
    
    /* 
     *   restore our full window area, adding back in the top line that we
     *   removed to make room for the mode line 
     */
    win->base.winy -= 1;
    win->base.ht += 1;
    win->base.scrolly -= 1;
    
    /* redraw the top line, where we drew the mode line */
    ossclr(win->base.winy, win->base.winx,
           win->base.winy, win->base.winx + win->base.wid - 1,
           win->base.oss_fillcolor);
    osgen_scrdisp(&win->base, 0, 0, win->base.wid);

    /* 
     *   Delete the temporary copy of the input from the scrollback buffer.
     *   To do this, restore the x,y position and free pointer, then delete
     *   extra lines from the end of the buffer until the last line points
     *   to the same text it did before we added the command input text.  
     */
    win->base.x = S_sbmode_orig_x;
    win->txtfree = S_sbmode_orig_txtfree;
    while (win->line_count > 1
           && osgen_get_line_ptr(win, win->base.y) != S_sbmode_orig_last_line)
    {
        /* this is an added line - delete the line */
        win->line_count--;
        win->base.y--;
    }

    /* we're no longer in scrollback mode */
    S_sbmode_win = 0;
}